

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O0

void query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
               (kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
                *tree)

{
  ostream *poVar1;
  neighbor<int,_float> nn;
  float query [3];
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::search_nn<float[3]>
            ((kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
              *)0x4080000040800000,(float (*) [3])CONCAT44(0x40800000,in_stack_ffffffffffffffe8),
             (neighbor_type *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  poVar1 = std::operator<<((ostream *)&std::cout,"Index closest point: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_ffffffffffffffe4);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void query_tree(Tree_ const& tree) {
  float query[3] = {4.0f, 4.0f, 4.0f};
  pico_tree::neighbor<int, float> nn;
  tree.search_nn(query, nn);

  std::cout << "Index closest point: " << nn.index << std::endl;
}